

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_4_4_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  float *data;
  int c1_2;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  int scale;
  long lVar40;
  int c2;
  int iVar41;
  long lVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  uint uVar46;
  int k_count;
  float *pfVar47;
  float *pfVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  ulong uVar52;
  float *pfVar53;
  int c2_2;
  int iVar54;
  int iVar55;
  int iVar56;
  int c1;
  int iVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  float *pfVar62;
  ulong uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  float fVar102;
  undefined1 auVar104 [12];
  undefined1 auVar103 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  undefined1 auVar108 [64];
  int data_width;
  int local_130;
  
  auVar72._8_4_ = 0x3effffff;
  auVar72._0_8_ = 0x3effffff3effffff;
  auVar72._12_4_ = 0x3effffff;
  auVar103 = ZEXT1664(auVar72);
  auVar71._8_4_ = 0x80000000;
  auVar71._0_8_ = 0x8000000080000000;
  auVar71._12_4_ = 0x80000000;
  auVar101 = ZEXT1664(auVar71);
  fVar79 = ipoint->scale;
  auVar108 = ZEXT464((uint)fVar79);
  auVar64 = vpternlogd_avx512vl(auVar72,ZEXT416((uint)fVar79),auVar71,0xf8);
  auVar64 = ZEXT416((uint)(fVar79 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  fVar77 = -0.08 / (fVar79 * fVar79);
  scale = (int)auVar64._0_4_;
  auVar65._0_4_ = (int)auVar64._0_4_;
  auVar65._4_4_ = (int)auVar64._4_4_;
  auVar65._8_4_ = (int)auVar64._8_4_;
  auVar65._12_4_ = (int)auVar64._12_4_;
  auVar64 = vcvtdq2ps_avx(auVar65);
  auVar65 = vpternlogd_avx512vl(auVar72,ZEXT416((uint)ipoint->x),auVar71,0xf8);
  auVar65 = ZEXT416((uint)(ipoint->x + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66._0_8_ = (double)auVar65._0_4_;
  auVar66._8_8_ = auVar65._8_8_;
  auVar70._0_8_ = (double)fVar79;
  auVar70._8_8_ = 0;
  auVar65 = vfmadd231sd_fma(auVar66,auVar70,ZEXT816(0x3fe0000000000000));
  auVar69._0_4_ = (float)auVar65._0_8_;
  auVar69._4_12_ = auVar65._4_12_;
  auVar65 = vpternlogd_avx512vl(auVar72,ZEXT416((uint)ipoint->y),auVar71,0xf8);
  fVar8 = auVar69._0_4_ - auVar64._0_4_;
  auVar65 = ZEXT416((uint)(ipoint->y + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar67._0_8_ = (double)auVar65._0_4_;
  auVar67._8_8_ = auVar65._8_8_;
  auVar65 = vfmadd231sd_fma(auVar67,auVar70,ZEXT816(0x3fe0000000000000));
  auVar66 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar79),auVar69);
  auVar68._0_4_ = (float)auVar65._0_8_;
  auVar68._4_12_ = auVar65._4_12_;
  fVar107 = auVar68._0_4_ - auVar64._0_4_;
  auVar64 = vpternlogd_avx512vl(auVar72,auVar66,auVar71,0xf8);
  auVar64 = ZEXT416((uint)(auVar66._0_4_ + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = ZEXT416((uint)fVar79);
  if (scale < (int)auVar64._0_4_) {
    auVar73._8_4_ = 0x3effffff;
    auVar73._0_8_ = 0x3effffff3effffff;
    auVar73._12_4_ = 0x3effffff;
    auVar74._8_4_ = 0x80000000;
    auVar74._0_8_ = 0x8000000080000000;
    auVar74._12_4_ = 0x80000000;
    auVar64 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar65,auVar68);
    auVar66 = vpternlogd_avx512vl(auVar74,auVar64,auVar73,0xea);
    auVar64 = ZEXT416((uint)(auVar64._0_4_ + auVar66._0_4_));
    auVar64 = vroundss_avx(auVar64,auVar64,0xb);
    if (scale < (int)auVar64._0_4_) {
      auVar64 = vfmadd231ss_fma(auVar69,auVar65,ZEXT416(0x41300000));
      auVar75._8_4_ = 0x80000000;
      auVar75._0_8_ = 0x8000000080000000;
      auVar75._12_4_ = 0x80000000;
      auVar66 = vpternlogd_avx512vl(auVar75,auVar64,auVar73,0xea);
      auVar64 = ZEXT416((uint)(auVar64._0_4_ + auVar66._0_4_));
      auVar64 = vroundss_avx(auVar64,auVar64,0xb);
      if ((int)auVar64._0_4_ + scale <= iimage->width) {
        auVar64 = vfmadd231ss_fma(auVar68,auVar65,ZEXT416(0x41300000));
        auVar16._8_4_ = 0x80000000;
        auVar16._0_8_ = 0x8000000080000000;
        auVar16._12_4_ = 0x80000000;
        auVar66 = vpternlogd_avx512vl(auVar73,auVar64,auVar16,0xf8);
        auVar64 = ZEXT416((uint)(auVar64._0_4_ + auVar66._0_4_));
        auVar64 = vroundss_avx(auVar64,auVar64,0xb);
        if ((int)auVar64._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar47 = iimage->data;
          iVar41 = scale * 2;
          fVar8 = fVar8 + 0.5;
          fVar107 = fVar107 + 0.5;
          pfVar53 = haarResponseY + 0x4b;
          pfVar62 = haarResponseX + 0x4b;
          uVar36 = 0xfffffff4;
          do {
            auVar64._0_4_ = (float)(int)uVar36;
            auVar104 = in_ZMM8._4_12_;
            auVar64._4_12_ = auVar104;
            auVar93._0_4_ = (float)(int)(uVar36 | 1);
            auVar93._4_12_ = auVar104;
            auVar98._0_4_ = (float)(int)(uVar36 | 2);
            auVar98._4_12_ = auVar104;
            auVar64 = vfmadd213ss_fma(auVar64,auVar65,ZEXT416((uint)fVar107));
            auVar66 = vfmadd213ss_fma(auVar93,auVar65,ZEXT416((uint)fVar107));
            auVar67 = vfmadd213ss_fma(auVar98,auVar65,ZEXT416((uint)fVar107));
            iVar23 = (int)auVar64._0_4_;
            iVar26 = (int)auVar66._0_4_;
            auVar94._0_4_ = (float)(int)(uVar36 | 3);
            auVar94._4_12_ = auVar104;
            iVar22 = (int)auVar67._0_4_;
            auVar64 = vfmadd213ss_fma(auVar94,auVar65,ZEXT416((uint)fVar107));
            iVar24 = (iVar23 + -1) * iVar1;
            iVar29 = (iVar23 + -1 + scale) * iVar1;
            iVar33 = (iVar23 + -1 + iVar41) * iVar1;
            iVar27 = (int)auVar64._0_4_;
            iVar25 = (iVar26 + -1 + iVar41) * iVar1;
            iVar32 = (iVar26 + -1) * iVar1;
            iVar30 = (iVar26 + -1 + scale) * iVar1;
            iVar23 = (iVar22 + -1) * iVar1;
            iVar26 = (iVar22 + -1 + iVar41) * iVar1;
            iVar31 = (iVar22 + -1 + scale) * iVar1;
            iVar28 = (iVar27 + -1) * iVar1;
            iVar22 = (iVar27 + -1 + scale) * iVar1;
            iVar27 = (iVar27 + -1 + iVar41) * iVar1;
            lVar60 = 0;
            do {
              iVar34 = (int)lVar60;
              auVar87._0_4_ = (float)(iVar34 + -0xc);
              auVar104 = auVar103._4_12_;
              auVar87._4_12_ = auVar104;
              auVar95._0_4_ = (float)(iVar34 + -10);
              auVar95._4_12_ = auVar104;
              auVar64 = vfmadd213ss_fma(auVar87,auVar65,ZEXT416((uint)fVar8));
              auVar66 = vfmadd213ss_fma(auVar95,auVar65,ZEXT416((uint)fVar8));
              iVar57 = (int)auVar64._0_4_;
              auVar88._0_4_ = (float)(iVar34 + -0xb);
              auVar88._4_12_ = auVar104;
              auVar64 = vfmadd213ss_fma(auVar88,auVar65,ZEXT416((uint)fVar8));
              iVar44 = iVar57 + -1 + scale;
              iVar43 = (int)auVar64._0_4_;
              auVar89._0_4_ = (float)(iVar34 + -9);
              auVar89._4_12_ = auVar104;
              iVar35 = iVar57 + -1 + iVar41;
              auVar64 = vfmadd213ss_fma(auVar89,auVar65,ZEXT416((uint)fVar8));
              fVar79 = pfVar47[iVar33 + -1 + iVar57];
              fVar78 = pfVar47[iVar24 + iVar35];
              auVar69 = SUB6416(ZEXT464(0x40000000),0);
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar24 + iVar44] -
                                                      pfVar47[iVar33 + iVar44])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar33 + iVar35] -
                                                      pfVar47[iVar24 + -1 + iVar57])));
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar29 + -1 + iVar57] -
                                                      pfVar47[iVar29 + iVar35])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar33 + iVar35] -
                                                      pfVar47[iVar24 + -1 + iVar57])));
              pfVar62[lVar60 + -0x4b] = (fVar79 - fVar78) + auVar67._0_4_;
              pfVar53[lVar60 + -0x4b] = auVar68._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar25 + -1 + iVar57];
              fVar78 = pfVar47[iVar32 + iVar35];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar44] -
                                                      pfVar47[iVar25 + iVar44])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar25 + iVar35] -
                                                      pfVar47[iVar32 + -1 + iVar57])));
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar30 + -1 + iVar57] -
                                                      pfVar47[iVar30 + iVar35])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar25 + iVar35] -
                                                      pfVar47[iVar32 + -1 + iVar57])));
              pfVar62[lVar60 + -0x33] = (fVar79 - fVar78) + auVar67._0_4_;
              pfVar53[lVar60 + -0x33] = auVar68._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar26 + -1 + iVar57];
              fVar78 = pfVar47[iVar23 + iVar35];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar23 + iVar44] -
                                                      pfVar47[iVar26 + iVar44])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar26 + iVar35] -
                                                      pfVar47[iVar23 + -1 + iVar57])));
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar31 + -1 + iVar57] -
                                                      pfVar47[iVar31 + iVar35])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar26 + iVar35] -
                                                      pfVar47[iVar23 + -1 + iVar57])));
              pfVar62[lVar60 + -0x1b] = (fVar79 - fVar78) + auVar67._0_4_;
              pfVar53[lVar60 + -0x1b] = auVar68._0_4_ - (fVar79 - fVar78);
              in_ZMM8 = ZEXT464((uint)pfVar47[iVar35 + iVar27]);
              iVar38 = (int)auVar66._0_4_;
              fVar79 = pfVar47[iVar27 + -1 + iVar57];
              fVar78 = pfVar47[iVar28 + iVar35];
              iVar45 = iVar43 + -1 + scale;
              iVar56 = iVar43 + -1 + iVar41;
              auVar67 = ZEXT416((uint)(pfVar47[iVar35 + iVar27] - pfVar47[iVar28 + -1 + iVar57]));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar44] -
                                                      pfVar47[iVar44 + iVar27])),auVar69,auVar67);
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar22 + -1 + iVar57] -
                                                      pfVar47[iVar22 + iVar35])),auVar69,auVar67);
              pfVar62[lVar60 + -3] = (fVar79 - fVar78) + auVar66._0_4_;
              pfVar53[lVar60 + -3] = auVar67._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar33 + -1 + iVar43];
              fVar78 = pfVar47[iVar24 + iVar56];
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar24 + iVar45] -
                                                      pfVar47[iVar33 + iVar45])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar33 + iVar56] -
                                                      pfVar47[iVar24 + -1 + iVar43])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar29 + -1 + iVar43] -
                                                      pfVar47[iVar29 + iVar56])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar33 + iVar56] -
                                                      pfVar47[iVar24 + -1 + iVar43])));
              pfVar62[lVar60 + -0x4a] = (fVar79 - fVar78) + auVar66._0_4_;
              pfVar53[lVar60 + -0x4a] = auVar67._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar25 + -1 + iVar43];
              fVar78 = pfVar47[iVar32 + iVar56];
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar45] -
                                                      pfVar47[iVar25 + iVar45])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar25 + iVar56] -
                                                      pfVar47[iVar32 + -1 + iVar43])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar30 + -1 + iVar43] -
                                                      pfVar47[iVar30 + iVar56])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar25 + iVar56] -
                                                      pfVar47[iVar32 + -1 + iVar43])));
              pfVar62[lVar60 + -0x32] = (fVar79 - fVar78) + auVar66._0_4_;
              pfVar53[lVar60 + -0x32] = auVar67._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar26 + -1 + iVar43];
              fVar78 = pfVar47[iVar23 + iVar56];
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar23 + iVar45] -
                                                      pfVar47[iVar26 + iVar45])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar26 + iVar56] -
                                                      pfVar47[iVar23 + -1 + iVar43])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar31 + -1 + iVar43] -
                                                      pfVar47[iVar31 + iVar56])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar26 + iVar56] -
                                                      pfVar47[iVar23 + -1 + iVar43])));
              pfVar62[lVar60 + -0x1a] = (fVar79 - fVar78) + auVar66._0_4_;
              pfVar53[lVar60 + -0x1a] = auVar67._0_4_ - (fVar79 - fVar78);
              auVar103 = ZEXT464((uint)pfVar47[iVar56 + iVar27]);
              iVar57 = (int)auVar64._0_4_;
              fVar79 = pfVar47[iVar27 + -1 + iVar43];
              fVar78 = pfVar47[iVar28 + iVar56];
              iVar44 = iVar38 + -1 + iVar41;
              auVar66 = ZEXT416((uint)(pfVar47[iVar56 + iVar27] - pfVar47[iVar28 + -1 + iVar43]));
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar45] -
                                                      pfVar47[iVar45 + iVar27])),auVar69,auVar66);
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar22 + -1 + iVar43] -
                                                      pfVar47[iVar22 + iVar56])),auVar69,auVar66);
              pfVar62[lVar60 + -2] = (fVar79 - fVar78) + auVar64._0_4_;
              pfVar53[lVar60 + -2] = auVar66._0_4_ - (fVar79 - fVar78);
              iVar35 = iVar38 + -1 + scale;
              fVar79 = pfVar47[iVar33 + -1 + iVar38];
              fVar78 = pfVar47[iVar24 + iVar44];
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar24 + iVar35] -
                                                      pfVar47[iVar33 + iVar35])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar33 + iVar44] -
                                                      pfVar47[iVar24 + -1 + iVar38])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar29 + -1 + iVar38] -
                                                      pfVar47[iVar29 + iVar44])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar33 + iVar44] -
                                                      pfVar47[iVar24 + -1 + iVar38])));
              pfVar62[lVar60 + -0x49] = (fVar79 - fVar78) + auVar64._0_4_;
              pfVar53[lVar60 + -0x49] = auVar66._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar25 + -1 + iVar38];
              fVar78 = pfVar47[iVar32 + iVar44];
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar35] -
                                                      pfVar47[iVar25 + iVar35])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar25 + iVar44] -
                                                      pfVar47[iVar32 + -1 + iVar38])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar30 + -1 + iVar38] -
                                                      pfVar47[iVar30 + iVar44])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar25 + iVar44] -
                                                      pfVar47[iVar32 + -1 + iVar38])));
              pfVar62[lVar60 + -0x31] = (fVar79 - fVar78) + auVar64._0_4_;
              pfVar53[lVar60 + -0x31] = auVar66._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar26 + -1 + iVar38];
              fVar78 = pfVar47[iVar23 + iVar44];
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar23 + iVar35] -
                                                      pfVar47[iVar26 + iVar35])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar26 + iVar44] -
                                                      pfVar47[iVar23 + -1 + iVar38])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar31 + -1 + iVar38] -
                                                      pfVar47[iVar31 + iVar44])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar26 + iVar44] -
                                                      pfVar47[iVar23 + -1 + iVar38])));
              pfVar62[lVar60 + -0x19] = (fVar79 - fVar78) + auVar64._0_4_;
              pfVar53[lVar60 + -0x19] = auVar66._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar27 + -1 + iVar38];
              fVar78 = pfVar47[iVar28 + iVar44];
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar35] -
                                                      pfVar47[iVar35 + iVar27])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar44 + iVar27] -
                                                      pfVar47[iVar28 + -1 + iVar38])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar22 + -1 + iVar38] -
                                                      pfVar47[iVar22 + iVar44])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar44 + iVar27] -
                                                      pfVar47[iVar28 + -1 + iVar38])));
              pfVar62[lVar60 + -1] = (fVar79 - fVar78) + auVar64._0_4_;
              pfVar53[lVar60 + -1] = auVar66._0_4_ - (fVar79 - fVar78);
              iVar35 = iVar57 + -1 + scale;
              iVar38 = iVar57 + -1 + iVar41;
              fVar79 = pfVar47[iVar33 + -1 + iVar57];
              fVar78 = pfVar47[iVar24 + iVar38];
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar24 + iVar35] -
                                                      pfVar47[iVar33 + iVar35])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar33 + iVar38] -
                                                      pfVar47[iVar24 + -1 + iVar57])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar29 + -1 + iVar57] -
                                                      pfVar47[iVar29 + iVar38])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar33 + iVar38] -
                                                      pfVar47[iVar24 + -1 + iVar57])));
              pfVar62[lVar60 + -0x48] = (fVar79 - fVar78) + auVar64._0_4_;
              pfVar53[lVar60 + -0x48] = auVar66._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar25 + -1 + iVar57];
              fVar78 = pfVar47[iVar32 + iVar38];
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar32 + iVar35] -
                                                      pfVar47[iVar25 + iVar35])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar25 + iVar38] -
                                                      pfVar47[iVar32 + -1 + iVar57])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar30 + -1 + iVar57] -
                                                      pfVar47[iVar30 + iVar38])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar25 + iVar38] -
                                                      pfVar47[iVar32 + -1 + iVar57])));
              pfVar62[lVar60 + -0x30] = (fVar79 - fVar78) + auVar64._0_4_;
              pfVar53[lVar60 + -0x30] = auVar66._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar26 + -1 + iVar57];
              fVar78 = pfVar47[iVar23 + iVar38];
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar23 + iVar35] -
                                                      pfVar47[iVar26 + iVar35])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar26 + iVar38] -
                                                      pfVar47[iVar23 + -1 + iVar57])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar31 + -1 + iVar57] -
                                                      pfVar47[iVar31 + iVar38])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar26 + iVar38] -
                                                      pfVar47[iVar23 + -1 + iVar57])));
              pfVar62[lVar60 + -0x18] = (fVar79 - fVar78) + auVar64._0_4_;
              pfVar53[lVar60 + -0x18] = auVar66._0_4_ - (fVar79 - fVar78);
              fVar79 = pfVar47[iVar27 + -1 + iVar57];
              fVar78 = pfVar47[iVar28 + iVar38];
              auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar28 + iVar35] -
                                                      pfVar47[iVar35 + iVar27])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar38 + iVar27] -
                                                      pfVar47[iVar28 + -1 + iVar57])));
              auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar47[iVar22 + -1 + iVar57] -
                                                      pfVar47[iVar22 + iVar38])),auVar69,
                                        ZEXT416((uint)(pfVar47[iVar38 + iVar27] -
                                                      pfVar47[iVar28 + -1 + iVar57])));
              pfVar62[lVar60] = (fVar79 - fVar78) + auVar64._0_4_;
              pfVar53[lVar60] = auVar66._0_4_ - (fVar79 - fVar78);
              lVar60 = lVar60 + 4;
            } while (iVar34 + -0xc < 8);
            pfVar53 = pfVar53 + 0x60;
            pfVar62 = pfVar62 + 0x60;
            bVar3 = (int)uVar36 < 8;
            uVar36 = uVar36 + 4;
          } while (bVar3);
          goto LAB_0021b0bc;
        }
      }
    }
  }
  iVar1 = scale * 2;
  lVar60 = 0;
  uVar36 = 0xfffffff4;
  do {
    auVar64 = vpbroadcastd_avx512vl();
    auVar17._8_4_ = 3;
    auVar17._0_8_ = 0x200000003;
    auVar17._12_4_ = 2;
    auVar64 = vporq_avx512vl(auVar64,auVar17);
    auVar20._4_4_ = fVar107;
    auVar20._0_4_ = fVar107;
    auVar20._8_4_ = fVar107;
    auVar20._12_4_ = fVar107;
    auVar64 = vpinsrd_avx(auVar64,uVar36 | 1,2);
    auVar64 = vpinsrd_avx(auVar64,uVar36,3);
    auVar64 = vcvtdq2ps_avx(auVar64);
    auVar21._4_4_ = fVar79;
    auVar21._0_4_ = fVar79;
    auVar21._8_4_ = fVar79;
    auVar21._12_4_ = fVar79;
    auVar64 = vfmadd132ps_fma(auVar64,auVar20,auVar21);
    uVar37 = vcmpps_avx512vl(auVar64,_DAT_00599190,0xd);
    auVar7 = vcvtps2pd_avx(auVar64);
    auVar82._8_8_ = 0xbfe0000000000000;
    auVar82._0_8_ = 0xbfe0000000000000;
    auVar82._16_8_ = 0xbfe0000000000000;
    auVar82._24_8_ = 0xbfe0000000000000;
    auVar76._12_4_ = 0x3fe00000;
    auVar76._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar76._16_8_ = 0x3fe0000000000000;
    auVar76._24_8_ = 0x3fe0000000000000;
    auVar76 = vblendmpd_avx512vl(auVar82,auVar76);
    bVar3 = (bool)((byte)uVar37 & 1);
    bVar4 = (bool)((byte)(uVar37 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar37 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar37 >> 3) & 1);
    auVar80._0_4_ =
         (int)((double)((ulong)bVar3 * auVar76._0_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar7._0_8_);
    auVar80._4_4_ =
         (int)((double)((ulong)bVar4 * auVar76._8_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar7._8_8_);
    auVar80._8_4_ =
         (int)((double)((ulong)bVar5 * auVar76._16_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar7._16_8_);
    auVar80._12_4_ =
         (int)((double)((ulong)bVar6 * auVar76._24_8_ | (ulong)!bVar6 * -0x4020000000000000) +
              auVar7._24_8_);
    auVar18._8_4_ = 1;
    auVar18._0_8_ = 0x100000001;
    auVar18._12_4_ = 1;
    uVar37 = vpcmpd_avx512vl(auVar80,auVar18,1);
    uVar63 = uVar37 & 0xf;
    iVar26 = iVar1 + auVar80._12_4_;
    iVar27 = auVar80._12_4_ + -1 + scale;
    iVar28 = iVar1 + -1 + auVar80._12_4_;
    iVar22 = auVar80._12_4_ + -1;
    uVar52 = uVar63 >> 1;
    iVar29 = iVar1 + auVar80._8_4_;
    iVar30 = auVar80._8_4_ + -1 + scale;
    iVar31 = auVar80._8_4_ + -1;
    iVar23 = iVar1 + -1 + auVar80._8_4_;
    iVar32 = iVar1 + auVar80._4_4_;
    iVar33 = auVar80._4_4_ + -1;
    uVar39 = uVar63 >> 2;
    uVar63 = uVar63 >> 3;
    iVar34 = auVar80._4_4_ + -1 + scale;
    iVar24 = iVar1 + -1 + auVar80._4_4_;
    iVar43 = auVar80._0_4_ + -1 + scale;
    iVar35 = iVar1 + auVar80._0_4_;
    iVar38 = iVar1 + -1 + auVar80._0_4_;
    iVar25 = auVar80._0_4_ + -1;
    pfVar47 = haarResponseX;
    pfVar62 = haarResponseY;
    lVar59 = lVar60;
    iVar41 = -0xc;
    do {
      auVar81._0_4_ = (float)iVar41;
      auVar100._4_12_ = auVar101._4_12_;
      auVar81._4_12_ = auVar100._4_12_;
      auVar67 = auVar108._0_16_;
      auVar64 = vfmadd213ss_fma(auVar81,auVar67,ZEXT416((uint)fVar8));
      auVar100._0_4_ = (float)(iVar41 + 1);
      fVar78 = auVar64._0_4_;
      auVar97._0_4_ = (float)(iVar41 + 2);
      auVar97._4_12_ = auVar103._4_12_;
      auVar91._0_4_ = (float)(iVar41 + 3);
      auVar91._4_12_ = auVar103._4_12_;
      auVar64 = vfmadd213ss_fma(auVar100,auVar67,ZEXT416((uint)fVar8));
      auVar101 = ZEXT1664(auVar64);
      auVar66 = vfmadd213ss_fma(auVar97,auVar67,ZEXT416((uint)fVar8));
      auVar67 = vfmadd213ss_fma(auVar91,auVar67,ZEXT416((uint)fVar8));
      fVar99 = auVar64._0_4_;
      fVar96 = auVar66._0_4_;
      fVar90 = auVar67._0_4_;
      iVar57 = (int)((double)((ulong)(0.0 <= fVar78) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar78) * -0x4020000000000000) + (double)fVar78);
      if ((iVar57 < 1 || uVar63 != 0) || (iimage->height < iVar26)) {
LAB_00219cb0:
        auVar101 = ZEXT1664(auVar64);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._12_4_,iVar57,scale,(float *)((long)pfVar47 + lVar59),
               (float *)((long)pfVar62 + lVar59));
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar56 = iimage->width;
        iVar44 = iVar1 + iVar57;
        if (iVar56 < iVar44) goto LAB_00219cb0;
        iVar45 = iimage->data_width;
        iVar54 = iVar57 + -1 + scale;
        pfVar53 = iimage->data;
        iVar51 = iVar45 * iVar22;
        iVar55 = iVar45 * iVar28;
        fVar78 = pfVar53[iVar55 + -1 + iVar57];
        fVar84 = pfVar53[iVar51 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar51 + iVar54] - pfVar53[iVar55 + iVar54]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar53[iVar55 + -1 + iVar44] -
                                                pfVar53[iVar51 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar45 * iVar27 + -1 + iVar57] -
                                                pfVar53[iVar45 * iVar27 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar53[iVar55 + -1 + iVar44] -
                                                pfVar53[iVar51 + -1 + iVar57])));
        *(float *)((long)pfVar47 + lVar59) = (fVar78 - fVar84) + auVar64._0_4_;
        *(float *)((long)pfVar62 + lVar59) = auVar66._0_4_ - (fVar78 - fVar84);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0x60);
      pfVar48 = (float *)((long)pfVar62 + lVar59 + 0x60);
      if (((iVar57 < 1 || (uVar39 & 1) != 0) || (iimage->height < iVar29)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._8_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar31;
        iVar51 = iVar45 * iVar23;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar84 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar30 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar30 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar84) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar84);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0xc0);
      pfVar48 = (float *)(lVar59 + 0xc0 + (long)pfVar62);
      if (((iVar57 < 1 || (uVar52 & 1) != 0) || (iimage->height < iVar32)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._4_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar33;
        iVar51 = iVar45 * iVar24;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar84 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar34 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar34 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar84) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar84);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0x120);
      pfVar48 = (float *)(lVar59 + 0x120 + (long)pfVar62);
      if (((iVar57 < 1 || (uVar37 & 1) != 0) || (iimage->height < iVar35)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._0_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar45 = iimage->data_width;
        iVar55 = iVar57 + -1 + scale;
        pfVar2 = iimage->data;
        iVar51 = iVar45 * iVar25;
        iVar54 = iVar45 * iVar38;
        fVar78 = pfVar2[iVar54 + -1 + iVar57];
        fVar84 = pfVar2[iVar51 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 + iVar55] - pfVar2[iVar54 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar44] -
                                                pfVar2[iVar51 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar43 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar43 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar44] -
                                                pfVar2[iVar51 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar84) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar84);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 4);
      pfVar48 = (float *)((long)pfVar62 + lVar59 + 4);
      iVar57 = (int)((double)((ulong)(0.0 <= fVar99) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar99) * -0x4020000000000000) + (double)fVar99);
      if (((iVar57 < 1 || uVar63 != 0) || (iimage->height < iVar26)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._12_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar22;
        iVar51 = iVar45 * iVar28;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar99 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar27 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar27 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar99) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar99);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 100);
      pfVar48 = (float *)((long)pfVar62 + lVar59 + 100);
      if (((iVar57 < 1 || (uVar39 & 1) != 0) || (iimage->height < iVar29)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._8_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar31;
        iVar51 = iVar45 * iVar23;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar99 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar30 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar30 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar99) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar99);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0xc4);
      pfVar48 = (float *)(lVar59 + 0xc4 + (long)pfVar62);
      if (((iVar57 < 1 || (uVar52 & 1) != 0) || (iimage->height < iVar32)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._4_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar33;
        iVar51 = iVar45 * iVar24;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar99 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar34 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar34 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar99) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar99);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0x124);
      pfVar48 = (float *)(lVar59 + 0x124 + (long)pfVar62);
      if (((iVar57 < 1 || (uVar37 & 1) != 0) || (iimage->height < iVar35)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._0_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar45 = iimage->data_width;
        iVar55 = iVar57 + -1 + scale;
        pfVar2 = iimage->data;
        iVar51 = iVar45 * iVar25;
        iVar54 = iVar45 * iVar38;
        fVar78 = pfVar2[iVar54 + -1 + iVar57];
        fVar99 = pfVar2[iVar51 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 + iVar55] - pfVar2[iVar54 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar44] -
                                                pfVar2[iVar51 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar43 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar43 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar44] -
                                                pfVar2[iVar51 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar99) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar99);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 8);
      pfVar48 = (float *)((long)pfVar62 + lVar59 + 8);
      iVar57 = (int)((double)((ulong)(0.0 <= fVar96) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar96) * -0x4020000000000000) + (double)fVar96);
      if (((iVar57 < 1 || uVar63 != 0) || (iimage->height < iVar26)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._12_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar22;
        iVar51 = iVar45 * iVar28;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar96 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar27 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar27 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar96) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar96);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0x68);
      pfVar48 = (float *)((long)pfVar62 + lVar59 + 0x68);
      if (((iVar57 < 1 || (uVar39 & 1) != 0) || (iimage->height < iVar29)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._8_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar31;
        iVar51 = iVar45 * iVar23;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar96 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar30 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar30 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar96) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar96);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 200);
      pfVar48 = (float *)(lVar59 + 200 + (long)pfVar62);
      if (((iVar57 < 1 || (uVar52 & 1) != 0) || (iimage->height < iVar32)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._4_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar33;
        iVar51 = iVar45 * iVar24;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar96 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar34 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar34 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar96) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar96);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0x128);
      pfVar48 = (float *)(lVar59 + 0x128 + (long)pfVar62);
      if (((iVar57 < 1 || (uVar37 & 1) != 0) || (iimage->height < iVar35)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._0_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar45 = iimage->data_width;
        iVar55 = iVar57 + -1 + scale;
        pfVar2 = iimage->data;
        iVar51 = iVar45 * iVar25;
        iVar54 = iVar45 * iVar38;
        fVar78 = pfVar2[iVar54 + -1 + iVar57];
        fVar96 = pfVar2[iVar51 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar51 + iVar55] - pfVar2[iVar54 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar44] -
                                                pfVar2[iVar51 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar43 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar43 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar54 + -1 + iVar44] -
                                                pfVar2[iVar51 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar96) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar96);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0xc);
      pfVar48 = (float *)((long)pfVar62 + lVar59 + 0xc);
      iVar57 = (int)((double)((ulong)(0.0 <= fVar90) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar90) * -0x4020000000000000) + (double)fVar90);
      if (((iVar57 < 1 || uVar63 != 0) || (iimage->height < iVar26)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._12_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar22;
        iVar51 = iVar45 * iVar28;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar90 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar27 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar27 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar90) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar90);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0x6c);
      pfVar48 = (float *)((long)pfVar62 + lVar59 + 0x6c);
      if (((iVar57 < 1 || (uVar39 & 1) != 0) || (iimage->height < iVar29)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._8_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar31;
        iVar51 = iVar45 * iVar23;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar90 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar30 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar30 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar90) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar90);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 0xcc);
      pfVar48 = (float *)(lVar59 + 0xcc + (long)pfVar62);
      if (((iVar57 < 1 || (uVar52 & 1) != 0) || (iimage->height < iVar32)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._4_4_,iVar57,scale,pfVar53,pfVar48);
        iVar56 = iimage->width;
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar54 = iVar57 + -1 + scale;
        iVar45 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar55 = iVar45 * iVar33;
        iVar51 = iVar45 * iVar24;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar90 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar54] - pfVar2[iVar51 + iVar54]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar45 * iVar34 + -1 + iVar57] -
                                                pfVar2[iVar45 * iVar34 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar90) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar90);
      }
      pfVar53 = (float *)((long)pfVar47 + lVar59 + 300);
      pfVar48 = (float *)(lVar59 + 300 + (long)pfVar62);
      if (((iVar57 < 1 || (uVar37 & 1) != 0) || (iimage->height < iVar35)) ||
         (iVar44 = iVar1 + iVar57, iVar56 < iVar44)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar103 = ZEXT1664(auVar103._0_16_);
        haarXY(iimage,auVar80._0_4_,iVar57,scale,pfVar53,pfVar48);
        pfVar47 = haarResponseX;
        pfVar62 = haarResponseY;
      }
      else {
        iVar56 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar45 = iVar57 + -1 + scale;
        iVar55 = iVar56 * iVar25;
        iVar51 = iVar56 * iVar38;
        fVar78 = pfVar2[iVar51 + -1 + iVar57];
        fVar90 = pfVar2[iVar55 + -1 + iVar44];
        auVar64 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar55 + iVar45] - pfVar2[iVar51 + iVar45]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        auVar66 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 * iVar43 + -1 + iVar57] -
                                                pfVar2[iVar56 * iVar43 + -1 + iVar44])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar51 + -1 + iVar44] -
                                                pfVar2[iVar55 + -1 + iVar57])));
        *pfVar53 = (fVar78 - fVar90) + auVar64._0_4_;
        *pfVar48 = auVar66._0_4_ - (fVar78 - fVar90);
      }
      auVar108 = ZEXT1664(auVar65);
      lVar59 = lVar59 + 0x10;
      bVar3 = iVar41 < 8;
      iVar41 = iVar41 + 4;
    } while (bVar3);
    lVar60 = lVar60 + 0x180;
    bVar3 = (int)uVar36 < 8;
    uVar36 = uVar36 + 4;
  } while (bVar3);
LAB_0021b0bc:
  fVar107 = auVar108._0_4_;
  auVar106._8_4_ = 0x3effffff;
  auVar106._0_8_ = 0x3effffff3effffff;
  auVar106._12_4_ = 0x3effffff;
  auVar105._8_4_ = 0x80000000;
  auVar105._0_8_ = 0x8000000080000000;
  auVar105._12_4_ = 0x80000000;
  auVar64 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 0.5)),auVar105,0xf8);
  auVar64 = ZEXT416((uint)(fVar107 * 0.5 + auVar64._0_4_));
  auVar64 = vroundss_avx(auVar64,auVar64,0xb);
  auVar65 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 1.5)),auVar105,0xf8);
  auVar65 = ZEXT416((uint)(fVar107 * 1.5 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 2.5)),auVar105,0xf8);
  auVar66 = ZEXT416((uint)(fVar107 * 2.5 + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar67 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 3.5)),auVar105,0xf8);
  auVar67 = ZEXT416((uint)(fVar107 * 3.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 4.5)),auVar105,0xf8);
  auVar68 = ZEXT416((uint)(fVar107 * 4.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 5.5)),auVar105,0xf8);
  auVar69 = ZEXT416((uint)(fVar107 * 5.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 6.5)),auVar105,0xf8);
  auVar70 = ZEXT416((uint)(fVar107 * 6.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 7.5)),auVar105,0xf8);
  auVar71 = ZEXT416((uint)(auVar71._0_4_ + fVar107 * 7.5));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 8.5)),auVar105,0xf8);
  auVar72 = ZEXT416((uint)(fVar107 * 8.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 9.5)),auVar105,0xf8);
  auVar73 = ZEXT416((uint)(fVar107 * 9.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 10.5)),auVar105,0xf8);
  auVar74 = ZEXT416((uint)(fVar107 * 10.5 + auVar74._0_4_));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar106,ZEXT416((uint)(fVar107 * 11.5)),auVar105,0xf8);
  fVar84 = auVar66._0_4_;
  fVar79 = fVar84 + auVar65._0_4_;
  fVar8 = fVar84 + auVar64._0_4_;
  auVar66 = ZEXT416((uint)(fVar107 * 11.5 + auVar75._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  fVar107 = fVar84 - auVar64._0_4_;
  fVar78 = fVar84 - auVar65._0_4_;
  fVar90 = fVar84 - auVar67._0_4_;
  fVar96 = fVar84 - auVar68._0_4_;
  fVar99 = fVar84 - auVar69._0_4_;
  fVar84 = fVar84 - auVar70._0_4_;
  fVar102 = auVar71._0_4_;
  fVar9 = fVar102 - auVar67._0_4_;
  fVar10 = fVar102 - auVar68._0_4_;
  fVar11 = fVar102 - auVar69._0_4_;
  fVar12 = fVar102 - auVar70._0_4_;
  fVar13 = fVar102 - auVar72._0_4_;
  fVar14 = fVar102 - auVar73._0_4_;
  fVar15 = fVar102 - auVar74._0_4_;
  fVar102 = fVar102 - auVar66._0_4_;
  gauss_s1_c0[0] = expf(fVar79 * fVar79 * fVar77);
  gauss_s1_c0[1] = expf(fVar8 * fVar8 * fVar77);
  gauss_s1_c0[2] = expf(fVar107 * fVar107 * fVar77);
  gauss_s1_c0[3] = expf(fVar78 * fVar78 * fVar77);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar90 * fVar90 * fVar77);
  gauss_s1_c0[6] = expf(fVar96 * fVar96 * fVar77);
  gauss_s1_c0[7] = expf(fVar99 * fVar99 * fVar77);
  gauss_s1_c0[8] = expf(fVar84 * fVar84 * fVar77);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar77);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar77);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar77);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar77);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar77);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar77);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar77);
  gauss_s1_c1[8] = expf(fVar102 * fVar102 * fVar77);
  auVar83._8_4_ = 0x7fffffff;
  auVar83._0_8_ = 0x7fffffff7fffffff;
  auVar83._12_4_ = 0x7fffffff;
  uVar37 = 0xfffffff8;
  fVar79 = 0.0;
  lVar60 = 0;
  lVar59 = 0;
  local_130 = 0;
  do {
    pfVar47 = gauss_s1_c1;
    uVar36 = (uint)uVar37;
    if (uVar36 != 7) {
      pfVar47 = gauss_s1_c0;
    }
    lVar58 = (long)local_130;
    lVar59 = (long)(int)lVar59;
    if (uVar36 == 0xfffffff8) {
      pfVar47 = gauss_s1_c1;
    }
    uVar52 = 0;
    local_130 = local_130 + 4;
    uVar46 = 0xfffffff8;
    lVar49 = (long)haarResponseX + lVar60;
    lVar40 = (long)haarResponseY + lVar60;
    do {
      pfVar62 = gauss_s1_c1;
      if (uVar46 != 7) {
        pfVar62 = gauss_s1_c0;
      }
      auVar101 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar46 == 0xfffffff8) {
        pfVar62 = gauss_s1_c1;
      }
      uVar63 = (ulong)(uVar46 >> 0x1c & 0xfffffff8);
      uVar39 = uVar52;
      lVar42 = lVar40;
      lVar61 = lVar49;
      do {
        lVar50 = 0;
        pfVar53 = (float *)((long)pfVar47 + (ulong)(uint)((int)(uVar37 >> 0x1f) << 5));
        do {
          fVar8 = pfVar62[uVar63] * *pfVar53;
          pfVar53 = pfVar53 + (ulong)(~uVar36 >> 0x1f) * 2 + -1;
          auVar64 = vinsertps_avx(ZEXT416(*(uint *)(lVar42 + lVar50 * 4)),
                                  ZEXT416(*(uint *)(lVar61 + lVar50 * 4)),0x10);
          lVar50 = lVar50 + 1;
          auVar92._0_4_ = fVar8 * auVar64._0_4_;
          auVar92._4_4_ = fVar8 * auVar64._4_4_;
          auVar92._8_4_ = fVar8 * auVar64._8_4_;
          auVar92._12_4_ = fVar8 * auVar64._12_4_;
          auVar64 = vandps_avx(auVar92,auVar83);
          auVar64 = vmovlhps_avx(auVar92,auVar64);
          auVar85._0_4_ = auVar101._0_4_ + auVar64._0_4_;
          auVar85._4_4_ = auVar101._4_4_ + auVar64._4_4_;
          auVar85._8_4_ = auVar101._8_4_ + auVar64._8_4_;
          auVar85._12_4_ = auVar101._12_4_ + auVar64._12_4_;
          auVar101 = ZEXT1664(auVar85);
        } while (lVar50 != 9);
        uVar39 = uVar39 + 0x18;
        uVar63 = uVar63 + (ulong)(-1 < (int)uVar46) * 2 + -1;
        lVar61 = lVar61 + 0x60;
        lVar42 = lVar42 + 0x60;
      } while (uVar39 < uVar46 * 0x18 + 0x198);
      uVar46 = uVar46 + 5;
      uVar52 = uVar52 + 0x78;
      fVar8 = gauss_s2_arr[lVar58];
      auVar19._4_4_ = fVar8;
      auVar19._0_4_ = fVar8;
      auVar19._8_4_ = fVar8;
      auVar19._12_4_ = fVar8;
      auVar67 = vmulps_avx512vl(auVar85,auVar19);
      lVar58 = lVar58 + 1;
      auVar86._0_4_ = auVar67._0_4_ * auVar67._0_4_;
      auVar86._4_4_ = auVar67._4_4_ * auVar67._4_4_;
      auVar86._8_4_ = auVar67._8_4_ * auVar67._8_4_;
      auVar86._12_4_ = auVar67._12_4_ * auVar67._12_4_;
      auVar65 = vshufpd_avx(auVar67,auVar67,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar59) = auVar67;
      lVar59 = lVar59 + 4;
      lVar49 = lVar49 + 0x1e0;
      lVar40 = lVar40 + 0x1e0;
      auVar64 = vmovshdup_avx(auVar86);
      auVar66 = vfmadd231ss_fma(auVar64,auVar67,auVar67);
      auVar64 = vshufps_avx(auVar67,auVar67,0xff);
      auVar65 = vfmadd213ss_fma(auVar65,auVar65,auVar66);
      auVar64 = vfmadd213ss_fma(auVar64,auVar64,auVar65);
      fVar79 = fVar79 + auVar64._0_4_;
    } while (local_130 != (int)lVar58);
    lVar60 = lVar60 + 0x14;
    uVar37 = (ulong)(uVar36 + 5);
  } while ((int)uVar36 < 3);
  if (fVar79 < 0.0) {
    fVar79 = sqrtf(fVar79);
  }
  else {
    auVar64 = vsqrtss_avx(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
    fVar79 = auVar64._0_4_;
  }
  lVar60 = 0;
  auVar101 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar79)));
  do {
    auVar103 = vmulps_avx512f(auVar101,*(undefined1 (*) [64])(ipoint->descriptor + lVar60));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar60) = auVar103;
    lVar60 = lVar60 + 0x10;
  } while (lVar60 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_4_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=4, k_count+=4) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}